

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O0

void Tim_ManCreateBox(Tim_Man_t *p,int firstIn,int nIns,int firstOut,int nOuts,int iDelayTable,
                     int fBlack)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int *__s;
  int local_34;
  int i;
  Tim_Box_t *pBox;
  int iDelayTable_local;
  int nOuts_local;
  int firstOut_local;
  int nIns_local;
  int firstIn_local;
  Tim_Man_t *p_local;
  
  if (p->vBoxes == (Vec_Ptr_t *)0x0) {
    pVVar2 = Vec_PtrAlloc(100);
    p->vBoxes = pVVar2;
  }
  __s = (int *)Mem_FlexEntryFetch(p->pMemObj,(nIns + nOuts) * 4 + 0x1c);
  memset(__s,0,0x1c);
  iVar1 = Vec_PtrSize(p->vBoxes);
  *__s = iVar1;
  Vec_PtrPush(p->vBoxes,__s);
  __s[4] = iDelayTable;
  __s[2] = nIns;
  __s[3] = nOuts;
  __s[6] = fBlack;
  local_34 = 0;
  while( true ) {
    if (nIns <= local_34) {
      local_34 = 0;
      while( true ) {
        if (nOuts <= local_34) {
          return;
        }
        if (p->nCis <= firstOut + local_34) break;
        __s[(long)(nIns + local_34) + 7] = firstOut + local_34;
        p->pCis[firstOut + local_34].iObj2Box = *__s;
        p->pCis[firstOut + local_34].iObj2Num = local_34;
        local_34 = local_34 + 1;
      }
      __assert_fail("firstOut+i < p->nCis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timBox.c"
                    ,0x43,"void Tim_ManCreateBox(Tim_Man_t *, int, int, int, int, int, int)");
    }
    if (p->nCos <= firstIn + local_34) break;
    __s[(long)local_34 + 7] = firstIn + local_34;
    p->pCos[firstIn + local_34].iObj2Box = *__s;
    p->pCos[firstIn + local_34].iObj2Num = local_34;
    local_34 = local_34 + 1;
  }
  __assert_fail("firstIn+i < p->nCos",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timBox.c"
                ,0x3c,"void Tim_ManCreateBox(Tim_Man_t *, int, int, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the new timing box.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManCreateBox( Tim_Man_t * p, int firstIn, int nIns, int firstOut, int nOuts, int iDelayTable, int fBlack )
{
    Tim_Box_t * pBox;
    int i;
    if ( p->vBoxes == NULL )
        p->vBoxes = Vec_PtrAlloc( 100 );
    pBox = (Tim_Box_t *)Mem_FlexEntryFetch( p->pMemObj, sizeof(Tim_Box_t) + sizeof(int) * (nIns+nOuts) );
    memset( pBox, 0, sizeof(Tim_Box_t) );
    pBox->iBox = Vec_PtrSize( p->vBoxes );
    Vec_PtrPush( p->vBoxes, pBox );
    pBox->iDelayTable = iDelayTable;
    pBox->nInputs  = nIns;
    pBox->nOutputs = nOuts;
    pBox->fBlack = fBlack;
    for ( i = 0; i < nIns; i++ )
    {
        assert( firstIn+i < p->nCos );
        pBox->Inouts[i] = firstIn+i;
        p->pCos[firstIn+i].iObj2Box = pBox->iBox;
        p->pCos[firstIn+i].iObj2Num = i;
    }
    for ( i = 0; i < nOuts; i++ )
    {
        assert( firstOut+i < p->nCis );
        pBox->Inouts[nIns+i] = firstOut+i;
        p->pCis[firstOut+i].iObj2Box = pBox->iBox;
        p->pCis[firstOut+i].iObj2Num = i;
    }
//    if ( pBox->iBox < 20 )
//        printf( "%4d  %4d  %4d  %4d  \n", firstIn, nIns, firstOut, nOuts );
}